

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O1

void __thiscall FileReader::FileReader(FileReader *this,string *filename)

{
  pointer pcVar1;
  ulong uVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  vector<char,_std::allocator<char>_> local_78;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + filename->_M_string_length);
  std::fstream::fstream((fstream *)&this->file,(string *)filename,_S_in|_S_bin|_S_ate);
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BufferReader::BufferReader(&this->buffer,&local_78);
  if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar2 = std::istream::tellg();
  if (-1 < (long)uVar2) {
    std::istream::seekg(&this->file,0,0);
    this->size = uVar2;
    this->offset = 0;
    if ((uVar2 & 3) == 0) {
      return;
    }
    __assert_fail("size % sizeof(float) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/src/io_utils/file_reader.cpp"
                  ,0x16,"FileReader::FileReader(const std::string &)");
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Failed to get size of file ",filename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)*plVar3;
  plVar4 = plVar3 + 2;
  if ((long *)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == plVar4) {
    local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar4;
    lStack_60 = plVar3[3];
    local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar4;
  }
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_78);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FileReader::FileReader(const std::string &filename) :
		filename(filename),
		file(std::fstream(filename, std::ios::in | std::ios::binary | std::ios::ate)),
		buffer(BufferReader(std::vector<char>()))
{
	ptrdiff_t file_size = file.tellg();
	if (file_size < 0) {
		throw std::runtime_error("Failed to get size of file " + filename + "!");
	}
	file.seekg(0);

	size = (size_t) file_size;
	offset = 0;
	assert(size % sizeof(float) == 0);
}